

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O1

Instr * __thiscall
Inline::PrepareInsertionPoint
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *funcInfo,Instr *insertBeforeInstr)

{
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  byte bVar5;
  undefined4 *puVar6;
  BailOutInstrTemplate<IR::Instr> *this_00;
  Opnd *this_01;
  intptr_t address;
  AddrOpnd *this_02;
  
  if (insertBeforeInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x11df,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar3) goto LAB_0055910d;
    *puVar6 = 0;
  }
  if (insertBeforeInstr->m_func != callInstr->m_func) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x11e0,"(insertBeforeInstr->m_func == callInstr->m_func)",
                       "insertBeforeInstr->m_func == callInstr->m_func");
    if (!bVar3) goto LAB_0055910d;
    *puVar6 = 0;
  }
  this_00 = IR::BailOutInstrTemplate<IR::Instr>::New
                      (CheckFuncInfo,BailOutOnInlineFunction,insertBeforeInstr,callInstr->m_func);
  this_01 = callInstr->m_src1;
  OVar4 = IR::Opnd::GetKind(this_01);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_0055910d;
    *puVar6 = 0;
  }
  if ((this_00->super_Instr).m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_0055910d;
    *puVar6 = 0;
  }
  pFVar1 = (this_00->super_Instr).m_func;
  if (this_01->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) goto LAB_0055910d;
    *puVar6 = 0;
  }
  bVar5 = this_01->field_0xb;
  if ((bVar5 & 2) != 0) {
    this_01 = IR::Opnd::Copy(this_01,pFVar1);
    bVar5 = this_01->field_0xb;
  }
  this_01->field_0xb = bVar5 | 2;
  (this_00->super_Instr).m_src1 = this_01;
  address = FunctionJITTimeInfo::GetFunctionInfoAddr(funcInfo);
  this_02 = IR::AddrOpnd::New(address,AddrOpndKindDynamicFunctionInfo,insertBeforeInstr->m_func,
                              false,(Var)0x0);
  if ((this_00->super_Instr).m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_0055910d;
    *puVar6 = 0;
  }
  pFVar1 = (this_00->super_Instr).m_func;
  if ((this_02->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_0055910d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  bVar5 = (this_02->super_Opnd).field_0xb;
  if ((bVar5 & 2) != 0) {
    this_02 = (AddrOpnd *)IR::Opnd::Copy(&this_02->super_Opnd,pFVar1);
    bVar5 = (this_02->super_Opnd).field_0xb;
  }
  (this_02->super_Opnd).field_0xb = bVar5 | 2;
  (this_00->super_Instr).m_src2 = &this_02->super_Opnd;
  IR::Instr::SetByteCodeOffset(&this_00->super_Instr,insertBeforeInstr);
  IR::Instr::InsertBefore(insertBeforeInstr,&this_00->super_Instr);
  IR::Instr::ShareBailOut(&this_00->super_Instr);
  return &this_00->super_Instr;
}

Assistant:

IR::Instr *
Inline::PrepareInsertionPoint(IR::Instr *callInstr, const FunctionJITTimeInfo *funcInfo, IR::Instr *insertBeforeInstr)
{
    Assert(insertBeforeInstr);
    Assert(insertBeforeInstr->m_func == callInstr->m_func);

    IR::Instr* checkFuncInfo = IR::BailOutInstr::New(Js::OpCode::CheckFuncInfo, IR::BailOutOnInlineFunction, insertBeforeInstr, callInstr->m_func);
    checkFuncInfo->SetSrc1(callInstr->GetSrc1()->AsRegOpnd());

    IR::AddrOpnd* inlinedFuncInfo = IR::AddrOpnd::New(funcInfo->GetFunctionInfoAddr(), IR::AddrOpndKindDynamicFunctionInfo, insertBeforeInstr->m_func);
    checkFuncInfo->SetSrc2(inlinedFuncInfo);

    checkFuncInfo->SetByteCodeOffset(insertBeforeInstr);
    insertBeforeInstr->InsertBefore(checkFuncInfo);

    // checkFuncInfo can be hoisted later and then have its BailOutInfo garbage collected. Other instructions (ex: BailOnNotStackArgs) share
    // checkFuncInfo's BailOutInfo. Explicitly force sharedBailOutKind to be true to stop this BailOutInfo from being garbage collected.
    checkFuncInfo->ShareBailOut();

    return checkFuncInfo;
}